

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviewer.cpp
# Opt level: O0

bool __thiscall GraphViewer::addNode(GraphViewer *this,int id,int x,int y)

{
  Connection *this_00;
  bool bVar1;
  ostream *poVar2;
  string local_140 [55];
  allocator local_109;
  string local_108 [8];
  string str;
  char local_e8 [8];
  char buff [200];
  int y_local;
  int x_local;
  int id_local;
  GraphViewer *this_local;
  
  buff._196_4_ = y;
  if ((this->isDynamic & 1U) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "This graph is dynamic, so the provided x and y values for the node with id "
                            );
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,id);
    poVar2 = std::operator<<(poVar2," will be ignored");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  sprintf(local_e8,"addNode3 %d %d %d\n",(ulong)(uint)id,(ulong)(uint)x,(ulong)(uint)buff._196_4_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,local_e8,&local_109);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  this_00 = this->con;
  std::__cxx11::string::string(local_140,local_108);
  bVar1 = Connection::sendMsg(this_00,(string *)local_140);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_108);
  return bVar1;
}

Assistant:

bool GraphViewer::addNode(int id, int x, int y) {
	if(isDynamic) {
		cerr << "This graph is dynamic, "
				"so the provided x and y values for the node with id "
				<< id << " will be ignored" << endl;
	}

	char buff[200];
	sprintf(buff, "addNode3 %d %d %d\n", id, x, y);
	string str(buff);
	return con->sendMsg(str);
}